

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

int archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  private_data_conflict5 *ppVar4;
  byte *pbVar5;
  byte *local_50;
  uchar *bp;
  int local_40;
  int ret;
  int disp;
  int c;
  int ratio;
  int i;
  private_data_conflict5 *state;
  size_t length_local;
  void *buff_local;
  archive_write_filter *f_local;
  
  plVar1 = (long *)f->data;
  if (length == 0) {
    f_local._4_4_ = 0;
  }
  else {
    local_50 = (byte *)buff;
    state = (private_data_conflict5 *)length;
    if (*plVar1 == 0) {
      *(uint *)((long)plVar1 + 0x65164) = (uint)*buff;
      *plVar1 = *plVar1 + 1;
      local_50 = (byte *)((long)buff + 1);
      state = (private_data_conflict5 *)(length - 1);
    }
LAB_005e878d:
    do {
      while( true ) {
        ppVar4 = (private_data_conflict5 *)((long)&state[-1].compressed_offset + 7);
        if (state == (private_data_conflict5 *)0x0) {
          return 0;
        }
        pbVar5 = local_50 + 1;
        uVar2 = (uint)*local_50;
        *plVar1 = *plVar1 + 1;
        *(uint *)(plVar1 + 0xca2d) = uVar2 * 0x10000 + *(int *)((long)plVar1 + 0x65164);
        c = uVar2 << 8 ^ *(uint *)((long)plVar1 + 0x65164);
        local_50 = pbVar5;
        state = ppVar4;
        if (*(int *)((long)plVar1 + (long)c * 4 + 0x24) != (int)plVar1[0xca2d]) break;
        *(uint *)((long)plVar1 + 0x65164) = (uint)*(ushort *)((long)plVar1 + (long)c * 2 + 0x43648);
      }
      if (-1 < *(int *)((long)plVar1 + (long)c * 4 + 0x24)) {
        if (c == 0) {
          local_40 = 1;
        }
        else {
          local_40 = 0x10d89 - c;
        }
        do {
          c = c - local_40;
          if (c < 0) {
            c = c + 0x10d89;
          }
          if (*(int *)((long)plVar1 + (long)c * 4 + 0x24) == (int)plVar1[0xca2d]) {
            *(uint *)((long)plVar1 + 0x65164) =
                 (uint)*(ushort *)((long)plVar1 + (long)c * 2 + 0x43648);
            goto LAB_005e878d;
          }
        } while (-1 < *(int *)((long)plVar1 + (long)c * 4 + 0x24));
      }
      iVar3 = output_code(f,*(int *)((long)plVar1 + 0x65164));
      if (iVar3 != 0) {
        return iVar3;
      }
      *(uint *)((long)plVar1 + 0x65164) = uVar2;
      if (*(int *)((long)plVar1 + 0x6515c) < (int)plVar1[4]) {
        iVar3 = *(int *)((long)plVar1 + 0x6515c);
        *(int *)((long)plVar1 + 0x6515c) = iVar3 + 1;
        *(short *)((long)plVar1 + (long)c * 2 + 0x43648) = (short)iVar3;
        *(int *)((long)plVar1 + (long)c * 4 + 0x24) = (int)plVar1[0xca2d];
        goto LAB_005e878d;
      }
      if (*plVar1 < plVar1[2]) goto LAB_005e878d;
      plVar1[2] = *plVar1 + 10000;
      if ((*plVar1 < 0x800000) && (plVar1[1] != 0)) {
        disp = (int)((*plVar1 << 8) / plVar1[1]);
      }
      else {
        iVar3 = (int)(plVar1[1] / 0x100);
        if (iVar3 == 0) {
          disp = 0x7fffffff;
        }
        else {
          disp = (int)(*plVar1 / (long)iVar3);
        }
      }
      if ((int)plVar1[0xca2c] < disp) {
        *(int *)(plVar1 + 0xca2c) = disp;
        goto LAB_005e878d;
      }
      *(undefined4 *)(plVar1 + 0xca2c) = 0;
      memset((void *)((long)plVar1 + 0x24),0xff,0x43624);
      *(undefined4 *)((long)plVar1 + 0x6515c) = 0x101;
      f_local._4_4_ = output_code(f,0x100);
    } while (f_local._4_4_ == 0);
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) + state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}